

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_stack.c
# Opt level: O2

DS_STATUS ds_stack_push(DsStack *stack,void *data)

{
  int iVar1;
  DS_STATUS DVar2;
  
  if (stack == (DsStack *)0x0) {
    DVar2 = DS_STATUS_NULL;
  }
  else {
    iVar1 = stack->index;
    if ((ulong)(long)iVar1 < stack->max) {
      stack->index = iVar1 + 1;
      stack->elems[iVar1] = data;
      return DS_STATUS_OK;
    }
    DVar2 = DS_STATUS_FULL;
  }
  return DVar2;
}

Assistant:

DS_STATUS ds_stack_push(DsStack *stack, void *data)
{
    if (NULL == stack)
        return DS_STATUS_NULL;
    if (stack->index >= stack->max)
        return DS_STATUS_FULL;
    stack->elems[stack->index++] = data;
    return DS_STATUS_OK;
}